

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

char * get_str(char *str,char **name_p)

{
  void *ptr;
  undefined8 *in_RSI;
  char *in_RDI;
  char *name;
  int name_len;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  int local_14;
  char *local_8;
  
  local_14 = 0;
  ptr = INT_CMmalloc(in_stack_ffffffffffffffe0);
  local_8 = in_RDI;
  while (*local_8 != '\"') {
    ptr = INT_CMrealloc(ptr,in_stack_ffffffffffffffd8);
    *(char *)((long)ptr + (long)local_14) = *local_8;
    local_14 = local_14 + 1;
    local_8 = local_8 + 1;
  }
  *(undefined1 *)((long)ptr + (long)local_14) = 0;
  *in_RSI = ptr;
  return local_8 + 1;
}

Assistant:

static char *
get_str(char *str, const char **name_p)
{
    int name_len = 0;
    char *name = malloc(1);
    while (*str != '"') {
	name = realloc(name, (name_len + 2));
	name[name_len++] = *(str++);
    }
    name[name_len] = 0;
    str++;
    *name_p = name;
    return str;
}